

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

void sokoban_detect(level *lev)

{
  boolean bVar1;
  uint uVar2;
  int iVar3;
  rm *prVar4;
  uint local_40;
  int local_3c;
  uint local_38;
  int cmap;
  rm *loc;
  obj *obj;
  trap *ttmp;
  int y;
  int x;
  level *lev_local;
  
  for (ttmp._4_4_ = 1; ttmp._4_4_ < 0x50; ttmp._4_4_ = ttmp._4_4_ + 1) {
    for (ttmp._0_4_ = 0; (int)ttmp < 0x15; ttmp._0_4_ = (int)ttmp + 1) {
      prVar4 = lev->locations[ttmp._4_4_] + (int)ttmp;
      prVar4->seenv = 0xff;
      if (prVar4->typ == '\x0f') {
        prVar4->typ = '\x17';
      }
      else if (prVar4->typ == '\x10') {
        prVar4->typ = '\x18';
      }
      if (prVar4->typ == '\x18') {
        local_38 = *(uint *)&prVar4->field_0x6 >> 10 & 1;
      }
      else {
        local_38 = 1;
      }
      *(uint *)&prVar4->field_0x6 = *(uint *)&prVar4->field_0x6 & 0xfffff7ff | local_38 << 0xb;
      uVar2 = back_to_cmap(lev,(xchar)ttmp._4_4_,(xchar)(int)ttmp);
      *(uint *)prVar4 = *(uint *)prVar4 & 0xffffffc0 | uVar2 & 0x3f;
      if ((((uVar2 == 0x19) || (uVar2 == 0x1a)) || (uVar2 == 0x1b)) || (uVar2 == 0x1c)) {
        *(uint *)&lev->locations[ttmp._4_4_][(int)ttmp].field_0x6 =
             *(uint *)&lev->locations[ttmp._4_4_][(int)ttmp].field_0x6 & 0xfffffffe | 1;
        *(uint *)&lev->locations[ttmp._4_4_][(int)ttmp].field_0x6 =
             *(uint *)&lev->locations[ttmp._4_4_][(int)ttmp].field_0x6 & 0xfffffffd | 2;
      }
      else {
        *(uint *)&lev->locations[ttmp._4_4_][(int)ttmp].field_0x6 =
             *(uint *)&lev->locations[ttmp._4_4_][(int)ttmp].field_0x6 & 0xfffffffe;
        *(uint *)&lev->locations[ttmp._4_4_][(int)ttmp].field_0x6 =
             *(uint *)&lev->locations[ttmp._4_4_][(int)ttmp].field_0x6 & 0xfffffffd;
      }
      for (loc = (rm *)lev->objects[ttmp._4_4_][(int)ttmp]; loc != (rm *)0x0;
          loc = *(rm **)&loc->field_0x8) {
        if (*(short *)&loc[3].field_0x6 == 0x214) {
          if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
             ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
            local_3c = 0x214;
          }
          else {
            local_3c = display_rng(0x219);
            local_3c = local_3c + 1;
          }
          *(uint *)prVar4 = *(uint *)prVar4 & 0xffe007ff | (local_3c + 1U & 0x3ff) << 0xb;
        }
      }
    }
  }
  for (obj = (obj *)lev->lev_traps; obj != (obj *)0x0; obj = obj->nobj) {
    *(byte *)&obj->v = *(byte *)&obj->v & 0xdf | 0x20;
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
      local_40 = (uint)(*(byte *)&obj->v & 0x1f);
    }
    else {
      iVar3 = display_rng(0x18);
      local_40 = iVar3 + 1;
    }
    prVar4 = lev->locations[*(char *)((long)&obj->v + 1)] + *(char *)((long)&obj->v + 2);
    *(uint *)prVar4 = *(uint *)prVar4 & 0xfffff83f | (local_40 & 0x1f) << 6;
  }
  return;
}

Assistant:

void sokoban_detect(struct level *lev)
{
	int x, y;
	struct trap *ttmp;
	struct obj *obj;

	/* Map the background and boulders */
	for (x = 1; x < COLNO; x++)
	    for (y = 0; y < ROWNO; y++) {
		struct rm *loc = &lev->locations[x][y];
		int cmap;

		/* Set seen vector for all locations so travelling works
		 * on pre-mapped levels. */
		loc->seenv = SVALL;
		if (loc->typ == SDOOR)
		    loc->typ = DOOR;
		else if (loc->typ == SCORR)
		    loc->typ = CORR;
		loc->waslit = (loc->typ != CORR) ? TRUE : loc->lit;
		cmap = back_to_cmap(lev, x, y);

		loc->mem_bg = cmap;
		if (cmap == S_vodoor || cmap == S_hodoor ||
		    cmap == S_vcdoor || cmap == S_hcdoor) {
		    lev->locations[x][y].mem_door_l = 1;
		    lev->locations[x][y].mem_door_t = 1;
		} else {
		    lev->locations[x][y].mem_door_l = 0;
		    lev->locations[x][y].mem_door_t = 0;
		}

		for (obj = lev->objects[x][y]; obj; obj = obj->nexthere)
		    if (obj->otyp == BOULDER)
			loc->mem_obj = what_obj(BOULDER) + 1;
	    }

	/* Map the traps */
	for (ttmp = lev->lev_traps; ttmp; ttmp = ttmp->ntrap) {
	    ttmp->tseen = 1;
	    lev->locations[ttmp->tx][ttmp->ty].mem_trap = what_trap(ttmp->ttyp);
	}
}